

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::text::text(text *this,string *type)

{
  base_widget::base_widget((base_widget *)&(this->super_base_html_input).field_0x88);
  base_html_input::base_html_input
            (&this->super_base_html_input,&PTR_construction_vtable_24__002869c8,type);
  *(undefined1 **)&(this->super_base_html_input).field_0x38 =
       &(this->super_base_html_input).field_0x48;
  *(undefined8 *)&(this->super_base_html_input).field_0x40 = 0;
  (this->super_base_html_input).field_0x48 = 0;
  *(undefined8 *)&(this->super_base_html_input).field_0x58 = 0xffffffff00000000;
  (this->super_base_html_input).field_0x60 = 1;
  *(undefined8 *)&(this->super_base_html_input).field_0x70 = 0;
  (this->super_base_html_input)._vptr_base_html_input = (_func_int **)0x2868b8;
  *(undefined8 *)&(this->super_base_html_input).field_0x88 = 0x286970;
  *(undefined8 *)&(this->super_base_html_input).field_0x30 = 0x2868f8;
  *(undefined4 *)&(this->super_base_html_input).field_0x78 = 0xffffffff;
  *(undefined8 *)&(this->super_base_html_input).field_0x80 = 0;
  return;
}

Assistant:

text::text(std::string const &type): base_html_input(type), size_(-1) {}